

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void compileoptionusedFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  int iVal;
  uchar *zOptName;
  
  zOptName = sqlite3_value_text(*argv);
  if (zOptName != (uchar *)0x0) {
    iVal = sqlite3_compileoption_used((char *)zOptName);
    sqlite3_result_int(context,iVal);
    return;
  }
  return;
}

Assistant:

static void compileoptionusedFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const char *zOptName;
  assert( argc==1 );
  UNUSED_PARAMETER(argc);
  /* IMP: R-39564-36305 The sqlite_compileoption_used() SQL
  ** function is a wrapper around the sqlite3_compileoption_used() C/C++
  ** function.
  */
  if( (zOptName = (const char*)sqlite3_value_text(argv[0]))!=0 ){
    sqlite3_result_int(context, sqlite3_compileoption_used(zOptName));
  }
}